

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall OpenSteer::Camera::mouseAdjustOffset(Camera *this,Vec3 *adjustment)

{
  undefined8 uVar1;
  long *in_RDI;
  float fVar2;
  float extraout_XMM0_Db;
  Vec3 VVar3;
  Vec3 adjusted_4;
  Vec3 offset_4;
  Vec3 adjusted_3;
  Vec3 offset_3;
  Vec3 adjusted_2;
  Vec3 offset_2;
  Vec3 adjusted_1;
  Vec3 offset_1;
  Vec3 adjusted;
  Vec3 offset;
  AbstractVehicle *v;
  Vec3 *in_stack_fffffffffffffd38;
  Vec3 *in_stack_fffffffffffffd40;
  Vec3 *this_00;
  Vec3 *in_stack_fffffffffffffd48;
  Camera *in_stack_fffffffffffffd50;
  Camera *this_01;
  Vec3 local_260;
  Vec3 local_250;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  undefined8 local_220;
  Vec3 local_1f0;
  Vec3 local_1e0;
  Vec3 local_1d0;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a0;
  float local_188;
  Vec3 local_174 [3];
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  Vec3 local_118;
  undefined8 local_108;
  float local_100;
  Vec3 local_f8;
  undefined8 local_e8;
  float local_e0;
  Vec3 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  float local_a0;
  Vec3 local_78;
  Vec3 local_68;
  Vec3 local_58;
  undefined8 local_48;
  float local_40;
  Vec3 local_38;
  undefined8 local_28;
  float local_20;
  long *local_18;
  
  local_18 = (long *)in_RDI[9];
  switch((int)in_RDI[0x13]) {
  case 1:
    this_01 = (Camera *)(in_RDI + 0x15);
    VVar3 = Vec3::operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_38.z = VVar3.z;
    local_20 = local_38.z;
    local_38._0_8_ = VVar3._0_8_;
    local_28._0_4_ = local_38.x;
    local_28._4_4_ = local_38.y;
    local_38 = VVar3;
    VVar3 = mouseAdjustPolar(this_01,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    local_58.z = VVar3.z;
    local_40 = local_58.z;
    local_58._0_8_ = VVar3._0_8_;
    local_48._0_4_ = local_58.x;
    local_48._4_4_ = local_58.y;
    local_58 = VVar3;
    VVar3 = Vec3::operator+(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_78.z = VVar3.z;
    local_68.z = local_78.z;
    local_78._0_8_ = VVar3._0_8_;
    local_68.x = local_78.x;
    local_68.y = local_78.y;
    local_78 = VVar3;
    Vec3::operator=((Vec3 *)((long)in_RDI + 0x9c),&local_68);
    break;
  case 2:
    Vec3::Vec3(local_174,0.0,0.0,*(float *)(in_RDI + 0x19));
    VVar3 = mouseAdjustPolar(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             in_stack_fffffffffffffd40);
    local_188 = VVar3.z;
    *(float *)(in_RDI + 0x19) = local_188;
    break;
  case 3:
    local_c8 = (**(code **)(*in_RDI + 0x40))();
    this_00 = (Vec3 *)(in_RDI + 7);
    local_b8 = local_c8;
    VVar3 = Vec3::operator-(this_00,in_stack_fffffffffffffd38);
    local_d8.z = VVar3.z;
    local_a0 = local_d8.z;
    local_d8._0_8_ = VVar3._0_8_;
    local_a8._0_4_ = local_d8.x;
    local_a8._4_4_ = local_d8.y;
    local_d8 = VVar3;
    VVar3 = mouseAdjustPolar(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,this_00);
    local_f8.z = VVar3.z;
    local_e0 = local_f8.z;
    local_f8._0_8_ = VVar3._0_8_;
    local_e8._0_4_ = local_f8.x;
    local_e8._4_4_ = local_f8.y;
    local_f8 = VVar3;
    VVar3 = Vec3::operator+(this_00,in_stack_fffffffffffffd38);
    local_118.z = VVar3.z;
    local_100 = local_118.z;
    local_118._0_8_ = VVar3._0_8_;
    local_108._0_4_ = local_118.x;
    local_108._4_4_ = local_118.y;
    local_120 = local_118.z;
    local_128._0_4_ = local_118.x;
    local_128._4_4_ = local_118.y;
    fVar2 = local_118.z;
    uVar1 = local_118._0_8_;
    local_118 = VVar3;
    local_148 = (**(code **)(*in_RDI + 0x48))(uVar1);
    local_140 = fVar2;
    local_138 = local_148;
    local_130 = fVar2;
    fVar2 = Vec3::length((Vec3 *)0x15ac37);
    *(float *)(in_RDI + 0x18) = fVar2;
    (**(code **)(*in_RDI + 0x40))();
    *(float *)((long)in_RDI + 0xc4) = extraout_XMM0_Db - *(float *)((long)in_RDI + 0x3c);
    break;
  case 4:
    local_1b0 = (**(code **)(*local_18 + 0x78))();
    local_1a0 = local_1b0;
    VVar3 = mouseAdjustPolar(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             in_stack_fffffffffffffd40);
    fVar2 = VVar3.z;
    local_1d0._0_8_ = VVar3._0_8_;
    local_1c0._0_4_ = local_1d0.x;
    local_1c0._4_4_ = local_1d0.y;
    local_1d0 = VVar3;
    local_1b8 = fVar2;
    local_1f0._0_8_ = (**(code **)(*local_18 + 0x60))(local_18,&local_1c0);
    local_1f0.z = fVar2;
    local_1e0._0_8_ = local_1f0._0_8_;
    local_1e0.z = fVar2;
    Vec3::operator=((Vec3 *)((long)in_RDI + 0xcc),&local_1e0);
    break;
  case 5:
    local_230 = (**(code **)(*local_18 + 0x78))();
    local_220 = local_230;
    VVar3 = mouseAdjustOrtho(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             in_stack_fffffffffffffd40);
    fVar2 = VVar3.z;
    local_250._0_8_ = VVar3._0_8_;
    local_240._0_4_ = local_250.x;
    local_240._4_4_ = local_250.y;
    local_250 = VVar3;
    local_238 = fVar2;
    local_260._0_8_ = (**(code **)(*local_18 + 0x60))(local_18,&local_240);
    local_260.z = fVar2;
    Vec3::operator=((Vec3 *)(in_RDI + 0x1b),&local_260);
  }
  return;
}

Assistant:

void 
OpenSteer::Camera::mouseAdjustOffset (const Vec3& adjustment)
{
    // vehicle being tracked (just a reference with a more concise name)
    const AbstractVehicle& v = *vehicleToTrack;

    switch (mode)
    {
    case cmFixed:
        {
            const Vec3 offset = fixedPosition - fixedTarget;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedPosition = fixedTarget + adjusted;
            break;
        }
    case cmFixedDistanceOffset:
        {
            // XXX this is the oddball case, adjusting "position" instead
            // XXX of mode parameters, hence no smoothing during adjustment
            // XXX Plus the fixedDistVOffset feature complicates things
            const Vec3 offset = position() - target;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            // XXX --------------------------------------------------
//             position = target + adjusted;
//             fixedDistDistance = adjusted.length();
//             fixedDistVOffset = position.y - target.y;
            // XXX --------------------------------------------------
//             const float s = smoothMoveSpeed * (1.0f/40f);
//             const Vec3 newPosition = target + adjusted;
//             position = interpolate (s, position, newPosition);
//             fixedDistDistance = interpolate (s, fixedDistDistance, adjusted.length());
//             fixedDistVOffset = interpolate (s, fixedDistVOffset, position.y - target.y);
            // XXX --------------------------------------------------
//          position = target + adjusted;
            setPosition (target + adjusted);
            fixedDistDistance = adjusted.length();
//          fixedDistVOffset = position.y - target.y;
            fixedDistVOffset = position().y - target.y;
            // XXX --------------------------------------------------
            break;
        }
    case cmStraightDown:
        {
            const Vec3 offset (0, 0, lookdownDistance);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            lookdownDistance = adjusted.z;
            break;
        }
    case cmFixedLocalOffset:
        {
            const Vec3 offset = v.globalizeDirection (fixedLocalOffset);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedLocalOffset = v.localizeDirection (adjusted);
            break;
        }
    case cmOffsetPOV:
        {
            // XXX this might work better as a translation control, it is
            // XXX non-obvious using a polar adjustment when the view
            // XXX center is not at the camera aim target
            const Vec3 offset = v.globalizeDirection (povOffset);
            const Vec3 adjusted = mouseAdjustOrtho (adjustment, offset);
            povOffset = v.localizeDirection (adjusted);
            break;
        }
    default:
        break;
    }
}